

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::LambdaFunctions::ListLambdaBind
          (LambdaFunctions *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,bool has_index)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  reference this_00;
  pointer this_01;
  BoundLambdaExpression *pBVar2;
  ListLambdaBindData *this_02;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  long *local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  ListLambdaPrepareBind((LambdaFunctions *)&local_40,arguments,context,bound_function);
  if (local_40 == (long *)0x0) {
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,1);
    this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    pBVar2 = BaseExpression::Cast<duckdb::BoundLambdaExpression>(&this_01->super_BaseExpression);
    _Var1._M_head_impl =
         (pBVar2->lambda_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar2->lambda_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    this_02 = (ListLambdaBindData *)operator_new(0x30);
    local_38._M_head_impl = _Var1._M_head_impl;
    ListLambdaBindData::ListLambdaBindData
              (this_02,&(bound_function->super_BaseScalarFunction).return_type,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_38,has_index,false);
    if (local_38._M_head_impl != (Expression *)0x0) {
      (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    *(ListLambdaBindData **)this = this_02;
  }
  else {
    *(long **)this = local_40;
    local_40 = (long *)0x0;
  }
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> LambdaFunctions::ListLambdaBind(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments,
                                                         const bool has_index) {
	unique_ptr<FunctionData> bind_data = ListLambdaPrepareBind(arguments, context, bound_function);
	if (bind_data) {
		return bind_data;
	}

	// get the lambda expression and put it in the bind info
	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	auto lambda_expr = std::move(bound_lambda_expr.lambda_expr);

	return make_uniq<ListLambdaBindData>(bound_function.return_type, std::move(lambda_expr), has_index);
}